

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_bool tdefl_compress_block(tdefl_compressor *d,mz_bool static_block)

{
  mz_uint16 *pmVar1;
  mz_uint16 *pmVar2;
  byte bVar3;
  ushort uVar4;
  mz_uint8 *pmVar5;
  ushort uVar6;
  mz_uint8 (*pamVar7) [288];
  long lVar8;
  mz_uint16 (*pamVar9) [288];
  uint uVar10;
  uint uVar11;
  long lVar12;
  mz_uint16 *pmVar13;
  uint uVar14;
  byte *pbVar15;
  byte *pbVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  mz_uint8 *pmVar22;
  uint uVar23;
  byte bVar24;
  mz_uint mVar25;
  int iVar26;
  byte bVar27;
  bool bVar28;
  mz_uint8 code_sizes_to_pack [320];
  byte abStack_2b8 [320];
  byte local_178 [328];
  
  if (static_block == 0) {
    d->m_huff_count[0][0x100] = 1;
    tdefl_optimize_huffman_table(d,0,0x120,0xf,0);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,0);
    iVar26 = 0x11f;
    lVar12 = 0x9067;
    do {
      if (lVar12 - 0x8f49U < 0x102) {
        iVar26 = 0x101;
        break;
      }
      iVar26 = iVar26 + -1;
      lVar8 = lVar12 + -0x14;
      lVar12 = lVar12 + -1;
    } while (*(char *)((long)d->m_max_probes + lVar8) == '\0');
    iVar17 = 0x1f;
    lVar12 = 36999;
    do {
      if (lVar12 - 0x9069U < 2) {
        iVar17 = 1;
        break;
      }
      iVar17 = iVar17 + -1;
      lVar8 = lVar12 + -0x14;
      lVar12 = lVar12 + -1;
    } while (*(char *)((long)d->m_max_probes + lVar8) == '\0');
    memcpy(local_178,d->m_huff_code_sizes,(long)iVar26);
    memcpy(local_178 + iVar26,d->m_huff_code_sizes + 1,(long)iVar17);
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 0) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 2) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 4) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 6) = 0;
    pamVar9 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 8) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 10) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0xc) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0xe) = 0;
    pamVar9 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x10) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x12) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x14) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x16) = 0;
    pamVar9 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x18) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x1a) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x1c) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x1e) = 0;
    pamVar9 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x1e) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x20) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x22) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x24) = 0;
    if (iVar17 + iVar26 == 0) {
      uVar23 = 0;
    }
    else {
      pamVar9 = d->m_huff_count + 2;
      pmVar1 = d->m_huff_count[2] + 0x12;
      pmVar2 = d->m_huff_count[2] + 0x11;
      uVar20 = 0;
      uVar23 = 0;
      uVar19 = 0;
      uVar10 = 0;
      uVar21 = 0xff;
      do {
        bVar24 = local_178[uVar20];
        uVar18 = (ulong)bVar24;
        bVar27 = (byte)uVar21;
        if (uVar18 == 0) {
          if (uVar10 != 0) {
            if (uVar10 < 3) {
              (*pamVar9)[uVar21] = (*pamVar9)[uVar21] + (short)uVar10;
              uVar11 = uVar23;
              do {
                uVar23 = uVar11 + 1;
                abStack_2b8[uVar11] = bVar27;
                uVar10 = uVar10 - 1;
                uVar11 = uVar23;
              } while (uVar10 != 0);
            }
            else {
              pmVar13 = d->m_huff_count[2] + 0x10;
              *pmVar13 = *pmVar13 + 1;
              uVar11 = uVar23 + 1;
              abStack_2b8[uVar23] = 0x10;
              uVar23 = uVar23 + 2;
              abStack_2b8[uVar11] = (char)uVar10 - 3;
            }
          }
          uVar19 = uVar19 + 1;
          if (uVar19 == 0x8a) {
            *pmVar1 = *pmVar1 + 1;
            abStack_2b8[uVar23] = 0x12;
            abStack_2b8[uVar23 + 1] = 0x7f;
LAB_006f69fd:
            uVar23 = uVar23 + 2;
            uVar10 = 0;
            goto LAB_006f6a00;
          }
          uVar10 = 0;
        }
        else {
          if (uVar19 != 0) {
            if (uVar19 < 3) {
              (*pamVar9)[0] = (*pamVar9)[0] + (short)uVar19;
              uVar11 = uVar23;
              do {
                uVar23 = uVar11 + 1;
                abStack_2b8[uVar11] = 0;
                uVar19 = uVar19 - 1;
                uVar11 = uVar23;
              } while (uVar19 != 0);
            }
            else {
              bVar28 = uVar19 < 0xb;
              pmVar13 = pmVar1;
              if (bVar28) {
                pmVar13 = pmVar2;
              }
              *pmVar13 = *pmVar13 + 1;
              abStack_2b8[uVar23] = 0x12 - bVar28;
              abStack_2b8[uVar23 + 1] = (bVar28 * '\b' + (char)uVar19) - 0xb;
              uVar23 = uVar23 + 2;
            }
          }
          if (bVar24 == bVar27) {
            uVar10 = uVar10 + 1;
            if (uVar10 == 6) {
              pmVar13 = d->m_huff_count[2] + 0x10;
              *pmVar13 = *pmVar13 + 1;
              abStack_2b8[uVar23] = 0x10;
              abStack_2b8[uVar23 + 1] = 3;
              goto LAB_006f69fd;
            }
LAB_006f6a00:
            uVar19 = 0;
          }
          else {
            if (uVar10 != 0) {
              if (uVar10 < 3) {
                (*pamVar9)[uVar21] = (*pamVar9)[uVar21] + (short)uVar10;
                uVar19 = uVar23;
                do {
                  uVar23 = uVar19 + 1;
                  abStack_2b8[uVar19] = bVar27;
                  uVar10 = uVar10 - 1;
                  uVar19 = uVar23;
                } while (uVar10 != 0);
              }
              else {
                pmVar13 = d->m_huff_count[2] + 0x10;
                *pmVar13 = *pmVar13 + 1;
                uVar19 = uVar23 + 1;
                abStack_2b8[uVar23] = 0x10;
                uVar23 = uVar23 + 2;
                abStack_2b8[uVar19] = (char)uVar10 - 3;
              }
            }
            uVar21 = (ulong)uVar23;
            (*pamVar9)[uVar18] = (*pamVar9)[uVar18] + 1;
            uVar23 = uVar23 + 1;
            abStack_2b8[uVar21] = bVar24;
            uVar10 = 0;
            uVar19 = 0;
          }
        }
        uVar20 = uVar20 + 1;
        uVar21 = uVar18;
      } while (uVar20 != (uint)(iVar17 + iVar26));
      if (uVar10 == 0) {
        if (uVar19 != 0) {
          if (uVar19 < 3) {
            (*pamVar9)[0] = (*pamVar9)[0] + (short)uVar19;
            uVar10 = uVar23;
            do {
              uVar23 = uVar10 + 1;
              abStack_2b8[uVar10] = 0;
              uVar19 = uVar19 - 1;
              uVar10 = uVar23;
            } while (uVar19 != 0);
          }
          else {
            if (uVar19 < 0xb) {
              *pmVar2 = *pmVar2 + 1;
              abStack_2b8[uVar23] = 0x11;
              bVar24 = (char)uVar19 - 3;
            }
            else {
              *pmVar1 = *pmVar1 + 1;
              abStack_2b8[uVar23] = 0x12;
              bVar24 = (char)uVar19 - 0xb;
            }
            abStack_2b8[uVar23 + 1] = bVar24;
            uVar23 = uVar23 + 2;
          }
        }
      }
      else if (uVar10 < 3) {
        (*pamVar9)[uVar18] = (*pamVar9)[uVar18] + (short)uVar10;
        uVar19 = uVar23;
        do {
          uVar23 = uVar19 + 1;
          abStack_2b8[uVar19] = bVar24;
          uVar10 = uVar10 - 1;
          uVar19 = uVar23;
        } while (uVar10 != 0);
      }
      else {
        pmVar1 = d->m_huff_count[2] + 0x10;
        *pmVar1 = *pmVar1 + 1;
        uVar19 = uVar23 + 1;
        abStack_2b8[uVar23] = 0x10;
        uVar23 = uVar23 + 2;
        abStack_2b8[uVar19] = (char)uVar10 - 3;
      }
    }
    tdefl_optimize_huffman_table(d,2,0x13,7,0);
    mVar25 = 2 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
    d->m_bit_buffer = mVar25;
    uVar10 = d->m_bits_in + 2;
    d->m_bits_in = uVar10;
    while (7 < uVar10) {
      pmVar22 = d->m_pOutput_buf;
      if (pmVar22 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar22 + 1;
        *pmVar22 = (mz_uint8)mVar25;
        uVar10 = d->m_bits_in;
        mVar25 = d->m_bit_buffer;
      }
      mVar25 = mVar25 >> 8;
      d->m_bit_buffer = mVar25;
      uVar10 = uVar10 - 8;
      d->m_bits_in = uVar10;
    }
    if (0x1f < iVar26 - 0x101U) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/zip/src/miniz.h"
                    ,0xb28,"void tdefl_start_dynamic_block(tdefl_compressor *)");
    }
    mVar25 = iVar26 - 0x101U << ((byte)uVar10 & 0x1f) | mVar25;
    d->m_bit_buffer = mVar25;
    uVar11 = uVar10 + 5;
    d->m_bits_in = uVar11;
    if (2 < uVar10) {
      do {
        pmVar22 = d->m_pOutput_buf;
        if (pmVar22 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar22 + 1;
          *pmVar22 = (mz_uint8)mVar25;
          uVar11 = d->m_bits_in;
          mVar25 = d->m_bit_buffer;
        }
        mVar25 = mVar25 >> 8;
        d->m_bit_buffer = mVar25;
        uVar11 = uVar11 - 8;
        d->m_bits_in = uVar11;
      } while (7 < uVar11);
    }
    if (0x1f < iVar17 - 1U) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/zip/src/miniz.h"
                    ,0xb29,"void tdefl_start_dynamic_block(tdefl_compressor *)");
    }
    uVar19 = iVar17 - 1U << ((byte)uVar11 & 0x1f) | mVar25;
    d->m_bit_buffer = uVar19;
    uVar14 = uVar11 + 5;
    d->m_bits_in = uVar14;
    if (2 < uVar11) {
      do {
        pmVar22 = d->m_pOutput_buf;
        if (pmVar22 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar22 + 1;
          *pmVar22 = (mz_uint8)uVar19;
          uVar14 = d->m_bits_in;
          uVar19 = d->m_bit_buffer;
        }
        uVar19 = uVar19 >> 8;
        d->m_bit_buffer = uVar19;
        uVar14 = uVar14 - 8;
        d->m_bits_in = uVar14;
      } while (7 < uVar14);
    }
    uVar10 = 0x12;
    do {
      if (d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar10]] != '\0') goto LAB_006f6c30;
      bVar28 = uVar10 != 0;
      uVar10 = uVar10 - 1;
    } while (bVar28);
    uVar10 = 0xffffffff;
LAB_006f6c30:
    uVar11 = 3;
    if (3 < (int)uVar10) {
      uVar11 = uVar10;
    }
    if (0xf < uVar11 - 3) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/zip/src/miniz.h"
                    ,0xb30,"void tdefl_start_dynamic_block(tdefl_compressor *)");
    }
    uVar19 = uVar11 - 3 << ((byte)uVar14 & 0x1f) | uVar19;
    d->m_bit_buffer = uVar19;
    uVar10 = uVar14 + 4;
    d->m_bits_in = uVar10;
    if (3 < uVar14) {
      do {
        pmVar22 = d->m_pOutput_buf;
        if (pmVar22 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar22 + 1;
          *pmVar22 = (mz_uint8)uVar19;
          uVar10 = d->m_bits_in;
          uVar19 = d->m_bit_buffer;
        }
        uVar19 = uVar19 >> 8;
        d->m_bit_buffer = uVar19;
        uVar10 = uVar10 - 8;
        d->m_bits_in = uVar10;
      } while (7 < uVar10);
    }
    uVar21 = 0;
    do {
      uVar14 = (uint)d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar21]];
      if (7 < uVar14) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/zip/src/miniz.h"
                      ,0xb33,"void tdefl_start_dynamic_block(tdefl_compressor *)");
      }
      bVar24 = (byte)uVar10 & 0x1f;
      uVar19 = uVar19 | uVar14 << bVar24;
      d->m_bit_buffer = uVar19;
      uVar10 = uVar10 + 3;
      d->m_bits_in = uVar10;
      while (7 < uVar10) {
        pmVar22 = d->m_pOutput_buf;
        if (pmVar22 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar22 + 1;
          *pmVar22 = (mz_uint8)uVar19;
          uVar10 = d->m_bits_in;
          uVar19 = d->m_bit_buffer;
        }
        uVar19 = uVar19 >> 8;
        d->m_bit_buffer = uVar19;
        uVar10 = uVar10 - 8;
        d->m_bits_in = uVar10;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar11 + 1);
    if (uVar23 != 0) {
      uVar11 = 0 << bVar24;
      do {
        bVar24 = abStack_2b8[uVar11];
        uVar21 = (ulong)bVar24;
        if (0x12 < uVar21) {
          __assert_fail("code < TDEFL_MAX_HUFF_SYMBOLS_2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/zip/src/miniz.h"
                        ,0xb38,"void tdefl_start_dynamic_block(tdefl_compressor *)");
        }
        uVar4 = d->m_huff_codes[2][uVar21];
        bVar27 = d->m_huff_code_sizes[2][uVar21];
        if (uVar4 >> (bVar27 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/zip/src/miniz.h"
                        ,0xb39,"void tdefl_start_dynamic_block(tdefl_compressor *)");
        }
        uVar19 = (uint)uVar4 << ((byte)uVar10 & 0x1f) | uVar19;
        d->m_bit_buffer = uVar19;
        uVar10 = bVar27 + uVar10;
        d->m_bits_in = uVar10;
        while (7 < uVar10) {
          pmVar22 = d->m_pOutput_buf;
          if (pmVar22 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar22 + 1;
            *pmVar22 = (mz_uint8)uVar19;
            uVar10 = d->m_bits_in;
            uVar19 = d->m_bit_buffer;
          }
          uVar19 = uVar19 >> 8;
          d->m_bit_buffer = uVar19;
          uVar10 = uVar10 - 8;
          d->m_bits_in = uVar10;
        }
        uVar14 = uVar11 + 1;
        if (0xf < bVar24) {
          bVar24 = "\x02\x03\a"[bVar24 - 0x10];
          if (abStack_2b8[(ulong)uVar11 + 1] >> (bVar24 & 0x1f) != 0) {
            __assert_fail("bits <= ((1U << len) - 1U)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/zip/src/miniz.h"
                          ,0xb3c,"void tdefl_start_dynamic_block(tdefl_compressor *)");
          }
          uVar19 = (uint)abStack_2b8[(ulong)uVar11 + 1] << ((byte)uVar10 & 0x1f) | uVar19;
          d->m_bit_buffer = uVar19;
          uVar10 = (int)(char)bVar24 + uVar10;
          d->m_bits_in = uVar10;
          while (uVar14 = uVar11 + 2, 7 < uVar10) {
            pmVar22 = d->m_pOutput_buf;
            if (pmVar22 < d->m_pOutput_buf_end) {
              d->m_pOutput_buf = pmVar22 + 1;
              *pmVar22 = (mz_uint8)uVar19;
              uVar10 = d->m_bits_in;
              uVar19 = d->m_bit_buffer;
            }
            uVar19 = uVar19 >> 8;
            d->m_bit_buffer = uVar19;
            uVar10 = uVar10 - 8;
            d->m_bits_in = uVar10;
          }
        }
        uVar11 = uVar14;
      } while (uVar11 < uVar23);
    }
  }
  else {
    memset(d->m_huff_code_sizes,8,0x90);
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x90) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x91) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x92) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x93) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x94) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x95) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x96) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x97) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x98) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x99) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9a) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9b) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9c) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9d) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9e) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9f) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xaa) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xab) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xac) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xad) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xae) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xaf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xba) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbe) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 199) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 200) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xca) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xce) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xda) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xde) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xea) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xeb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xec) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xed) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xee) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xef) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfa) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfe) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xff) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x100) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x101) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x102) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x103) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x104) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x105) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x106) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x107) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x108) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x109) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10a) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10b) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10c) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10d) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10e) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10f) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x110) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x111) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x112) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x113) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x114) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x115) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x116) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x117) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x118) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x119) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11a) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11b) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11c) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11d) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11e) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11f) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 0) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 1) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 2) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 3) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 4) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 5) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 6) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 7) = '\x05';
    pamVar7 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar7 + 1) + 8) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 9) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 10) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0xb) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0xc) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0xd) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0xe) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0xf) = '\x05';
    pamVar7 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x10) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x11) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x12) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x13) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x14) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x15) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x16) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x17) = '\x05';
    pamVar7 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x18) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x19) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x1a) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x1b) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x1c) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x1d) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x1e) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x1f) = '\x05';
    tdefl_optimize_huffman_table(d,0,0x120,0xf,1);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,1);
    uVar19 = d->m_bit_buffer | 1 << (d->m_bits_in & 0x1f);
    d->m_bit_buffer = uVar19;
    uVar10 = d->m_bits_in + 2;
    d->m_bits_in = uVar10;
    while (7 < uVar10) {
      pmVar22 = d->m_pOutput_buf;
      if (pmVar22 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar22 + 1;
        *pmVar22 = (mz_uint8)uVar19;
        uVar10 = d->m_bits_in;
        uVar19 = d->m_bit_buffer;
      }
      uVar19 = uVar19 >> 8;
      d->m_bit_buffer = uVar19;
      uVar10 = uVar10 - 8;
      d->m_bits_in = uVar10;
    }
  }
  pmVar22 = d->m_lz_code_buf;
  if (pmVar22 < d->m_pLZ_code_buf) {
    uVar23 = 1;
    do {
      if (uVar23 == 1) {
        bVar24 = *pmVar22;
        pmVar22 = pmVar22 + 1;
        uVar23 = bVar24 | 0x100;
      }
      if ((uVar23 & 1) == 0) {
        bVar24 = d->m_huff_code_sizes[0][*pmVar22];
        if (bVar24 == 0) {
          __assert_fail("d->m_huff_code_sizes[0][lit]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/zip/src/miniz.h"
                        ,0xbda,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        uVar4 = d->m_huff_codes[0][*pmVar22];
        if (uVar4 >> (bVar24 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/zip/src/miniz.h"
                        ,0xbdb,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        pmVar22 = pmVar22 + 1;
        uVar19 = uVar19 | (uint)uVar4 << ((byte)uVar10 & 0x1f);
        d->m_bit_buffer = uVar19;
        uVar10 = bVar24 + uVar10;
        d->m_bits_in = uVar10;
        while (7 < uVar10) {
          pmVar5 = d->m_pOutput_buf;
          if (pmVar5 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar5 + 1;
            *pmVar5 = (mz_uint8)uVar19;
            uVar10 = d->m_bits_in;
            uVar19 = d->m_bit_buffer;
          }
          uVar19 = uVar19 >> 8;
          d->m_bit_buffer = uVar19;
          uVar10 = uVar10 - 8;
          d->m_bits_in = uVar10;
        }
      }
      else {
        bVar24 = *pmVar22;
        bVar27 = d->m_huff_code_sizes[0][s_tdefl_len_sym[bVar24]];
        if (bVar27 == 0) {
          __assert_fail("d->m_huff_code_sizes[0][s_tdefl_len_sym[match_len]]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/zip/src/miniz.h"
                        ,0xbc9,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        uVar4 = d->m_huff_codes[0][s_tdefl_len_sym[bVar24]];
        if (uVar4 >> (bVar27 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/zip/src/miniz.h"
                        ,0xbcb,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        bVar3 = pmVar22[2];
        uVar6 = *(ushort *)(pmVar22 + 1);
        uVar19 = uVar19 | (uint)uVar4 << ((byte)uVar10 & 0x1f);
        d->m_bit_buffer = uVar19;
        uVar10 = bVar27 + uVar10;
        d->m_bits_in = uVar10;
        while (7 < uVar10) {
          pmVar5 = d->m_pOutput_buf;
          if (pmVar5 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar5 + 1;
            *pmVar5 = (mz_uint8)uVar19;
            uVar10 = d->m_bits_in;
            uVar19 = d->m_bit_buffer;
          }
          uVar19 = uVar19 >> 8;
          d->m_bit_buffer = uVar19;
          uVar10 = uVar10 - 8;
          d->m_bits_in = uVar10;
        }
        bVar27 = ""[bVar24];
        if ((mz_bitmasks[bVar27] & (uint)bVar24) >> (bVar27 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/zip/src/miniz.h"
                        ,0xbcd,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        mVar25 = (mz_bitmasks[bVar27] & (uint)bVar24) << ((byte)uVar10 & 0x1f) | uVar19;
        d->m_bit_buffer = mVar25;
        uVar10 = bVar27 + uVar10;
        d->m_bits_in = uVar10;
        while (7 < uVar10) {
          pmVar5 = d->m_pOutput_buf;
          if (pmVar5 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar5 + 1;
            *pmVar5 = (mz_uint8)mVar25;
            uVar10 = d->m_bits_in;
            mVar25 = d->m_bit_buffer;
          }
          mVar25 = mVar25 >> 8;
          d->m_bit_buffer = mVar25;
          uVar10 = uVar10 - 8;
          d->m_bits_in = uVar10;
        }
        uVar19 = (uint)uVar6;
        pbVar16 = "" + bVar3;
        if (bVar3 < 2) {
          pbVar16 = "" + uVar19;
        }
        pbVar15 = "" + bVar3;
        if (bVar3 < 2) {
          pbVar15 = "" + uVar19;
        }
        uVar4 = d->m_huff_codes[1][*pbVar15];
        bVar24 = d->m_huff_code_sizes[1][*pbVar15];
        if (uVar4 >> (bVar24 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/zip/src/miniz.h"
                        ,0xbd6,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        bVar27 = *pbVar16;
        mVar25 = (uint)uVar4 << ((byte)uVar10 & 0x1f) | mVar25;
        d->m_bit_buffer = mVar25;
        uVar10 = bVar24 + uVar10;
        d->m_bits_in = uVar10;
        while (7 < uVar10) {
          pmVar5 = d->m_pOutput_buf;
          if (pmVar5 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar5 + 1;
            *pmVar5 = (mz_uint8)mVar25;
            uVar10 = d->m_bits_in;
            mVar25 = d->m_bit_buffer;
          }
          mVar25 = mVar25 >> 8;
          d->m_bit_buffer = mVar25;
          uVar10 = uVar10 - 8;
          d->m_bits_in = uVar10;
        }
        if ((uVar19 & mz_bitmasks[bVar27]) >> (bVar27 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/zip/src/miniz.h"
                        ,0xbd7,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        pmVar22 = pmVar22 + 3;
        uVar19 = (uVar19 & mz_bitmasks[bVar27]) << ((byte)uVar10 & 0x1f) | mVar25;
        d->m_bit_buffer = uVar19;
        uVar10 = bVar27 + uVar10;
        d->m_bits_in = uVar10;
        while (7 < uVar10) {
          pmVar5 = d->m_pOutput_buf;
          if (pmVar5 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar5 + 1;
            *pmVar5 = (mz_uint8)uVar19;
            uVar10 = d->m_bits_in;
            uVar19 = d->m_bit_buffer;
          }
          uVar19 = uVar19 >> 8;
          d->m_bit_buffer = uVar19;
          uVar10 = uVar10 - 8;
          d->m_bits_in = uVar10;
        }
      }
      uVar23 = uVar23 >> 1;
    } while (pmVar22 < d->m_pLZ_code_buf);
  }
  uVar4 = d->m_huff_codes[0][0x100];
  bVar24 = d->m_huff_code_sizes[0][0x100];
  if (uVar4 >> (bVar24 & 0x1f) == 0) {
    uVar19 = uVar19 | (uint)uVar4 << ((byte)uVar10 & 0x1f);
    d->m_bit_buffer = uVar19;
    uVar10 = bVar24 + uVar10;
    d->m_bits_in = uVar10;
    while (7 < uVar10) {
      pmVar22 = d->m_pOutput_buf;
      if (pmVar22 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar22 + 1;
        *pmVar22 = (mz_uint8)uVar19;
        uVar10 = d->m_bits_in;
        uVar19 = d->m_bit_buffer;
      }
      uVar19 = uVar19 >> 8;
      d->m_bit_buffer = uVar19;
      uVar10 = uVar10 - 8;
      d->m_bits_in = uVar10;
    }
    return (uint)(d->m_pOutput_buf < d->m_pOutput_buf_end);
  }
  __assert_fail("bits <= ((1U << len) - 1U)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/zip/src/miniz.h"
                ,0xbdf,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
}

Assistant:

static mz_bool tdefl_compress_block(tdefl_compressor *d, mz_bool static_block) {
  if (static_block)
    tdefl_start_static_block(d);
  else
    tdefl_start_dynamic_block(d);
  return tdefl_compress_lz_codes(d);
}